

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O3

Instr * __thiscall GlobOpt::EnsureDisableImplicitCallRegion(GlobOpt *this,Loop *loop)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  undefined4 *puVar6;
  Instr *this_00;
  LabelInstr *pLVar7;
  undefined4 extraout_var;
  MemRefOpnd *dstOpnd;
  IntConstOpnd *src1Opnd;
  IntConstOpnd *src1Opnd_00;
  Opnd *dstOpnd_00;
  IntConstOpnd *src1Opnd_01;
  Instr *pIVar8;
  BailOutInstrTemplate<IR::Instr> *instr;
  
  if (loop->bailOutInfo == (BailOutInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x29c,"(loop->bailOutInfo != nullptr)","loop->bailOutInfo != nullptr");
    if (!bVar3) goto LAB_0049b131;
    *puVar6 = 0;
  }
  pIVar8 = loop->endDisableImplicitCall;
  if (pIVar8 == (Instr *)0x0) {
    this_00 = EnsureBailTarget(this,loop);
    pLVar7 = Loop::GetLoopTopInstr(loop);
    pFVar1 = (pLVar7->super_Instr).m_func;
    if (loop->bailOutInfo->bailOutFunc != pFVar1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x2a6,"(loop->bailOutInfo->bailOutFunc == bailOutFunc)",
                         "loop->bailOutInfo->bailOutFunc == bailOutFunc");
      if (!bVar3) goto LAB_0049b131;
      *puVar6 = 0;
    }
    iVar5 = (*this->func->m_threadContextInfo->_vptr_ThreadContextInfo[4])();
    dstOpnd = IR::MemRefOpnd::New(CONCAT44(extraout_var,iVar5),TyInt8,pFVar1,AddrOpndKindDynamicMisc
                                 );
    src1Opnd = IR::IntConstOpnd::New(3,TyInt8,pFVar1,true);
    src1Opnd_00 = IR::IntConstOpnd::New(0,TyInt8,pFVar1,true);
    dstOpnd_00 = Lowerer::GetImplicitCallFlagsOpnd(pFVar1);
    src1Opnd_01 = IR::IntConstOpnd::New(1,TyInt8,pFVar1,true);
    pIVar8 = IR::Instr::New(Ld_A,dstOpnd_00,&src1Opnd_01->super_Opnd,pFVar1);
    IR::Instr::InsertBefore(this_00,pIVar8);
    pIVar8 = IR::Instr::New(Ld_A,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,pFVar1);
    IR::Instr::InsertBefore(this_00,pIVar8);
    pIVar8 = IR::Instr::New(Ld_A,&dstOpnd->super_Opnd,&src1Opnd_00->super_Opnd,pFVar1);
    IR::Instr::InsertBefore(this_00,pIVar8);
    instr = IR::BailOutInstrTemplate<IR::Instr>::New
                      (BailOnNotEqual,BailOutOnImplicitCalls,loop->bailOutInfo,
                       loop->bailOutInfo->bailOutFunc);
    if ((instr->super_Instr).m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar3) goto LAB_0049b131;
      *puVar6 = 0;
    }
    pFVar1 = (instr->super_Instr).m_func;
    if (dstOpnd_00->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar3) goto LAB_0049b131;
      *puVar6 = 0;
    }
    bVar4 = dstOpnd_00->field_0xb;
    if ((bVar4 & 2) != 0) {
      dstOpnd_00 = IR::Opnd::Copy(dstOpnd_00,pFVar1);
      bVar4 = dstOpnd_00->field_0xb;
    }
    dstOpnd_00->field_0xb = bVar4 | 2;
    (instr->super_Instr).m_src1 = dstOpnd_00;
    if ((instr->super_Instr).m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar3) goto LAB_0049b131;
      *puVar6 = 0;
    }
    pFVar1 = (instr->super_Instr).m_func;
    if ((src1Opnd_01->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar3) {
LAB_0049b131:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    bVar4 = (src1Opnd_01->super_Opnd).field_0xb;
    if ((bVar4 & 2) != 0) {
      src1Opnd_01 = (IntConstOpnd *)IR::Opnd::Copy(&src1Opnd_01->super_Opnd,pFVar1);
      bVar4 = (src1Opnd_01->super_Opnd).field_0xb;
    }
    (src1Opnd_01->super_Opnd).field_0xb = bVar4 | 2;
    (instr->super_Instr).m_src2 = &src1Opnd_01->super_Opnd;
    IR::Instr::InsertBefore(this_00,&instr->super_Instr);
    loop->endDisableImplicitCall = pIVar8;
  }
  return pIVar8;
}

Assistant:

IR::Instr *
GlobOpt::EnsureDisableImplicitCallRegion(Loop * loop)
{
    Assert(loop->bailOutInfo != nullptr);
    IR::Instr * endDisableImplicitCall = loop->endDisableImplicitCall;
    if (endDisableImplicitCall)
    {
        return endDisableImplicitCall;
    }

    IR::Instr * bailOutTarget = EnsureBailTarget(loop);

    Func * bailOutFunc = loop->GetFunc();
    Assert(loop->bailOutInfo->bailOutFunc == bailOutFunc);

    IR::MemRefOpnd * disableImplicitCallAddress = IR::MemRefOpnd::New(this->func->GetThreadContextInfo()->GetDisableImplicitFlagsAddr(), TyInt8, bailOutFunc);
    IR::IntConstOpnd * disableImplicitCallAndExceptionValue = IR::IntConstOpnd::New(DisableImplicitCallAndExceptionFlag, TyInt8, bailOutFunc, true);
    IR::IntConstOpnd * enableImplicitCallAndExceptionValue = IR::IntConstOpnd::New(DisableImplicitNoFlag, TyInt8, bailOutFunc, true);

    IR::Opnd * implicitCallFlags = Lowerer::GetImplicitCallFlagsOpnd(bailOutFunc);
    IR::IntConstOpnd * noImplicitCall = IR::IntConstOpnd::New(Js::ImplicitCall_None, TyInt8, bailOutFunc, true);

    // Consider: if we are already doing implicit call in the outer loop, we don't need to clear the implicit call bit again
    IR::Instr * clearImplicitCall = IR::Instr::New(Js::OpCode::Ld_A, implicitCallFlags, noImplicitCall, bailOutFunc);
    bailOutTarget->InsertBefore(clearImplicitCall);

    IR::Instr * disableImplicitCall = IR::Instr::New(Js::OpCode::Ld_A, disableImplicitCallAddress, disableImplicitCallAndExceptionValue, bailOutFunc);
    bailOutTarget->InsertBefore(disableImplicitCall);

    endDisableImplicitCall = IR::Instr::New(Js::OpCode::Ld_A, disableImplicitCallAddress, enableImplicitCallAndExceptionValue, bailOutFunc);
    bailOutTarget->InsertBefore(endDisableImplicitCall);

    IR::BailOutInstr * bailOutInstr = IR::BailOutInstr::New(Js::OpCode::BailOnNotEqual, IR::BailOutOnImplicitCalls, loop->bailOutInfo, loop->bailOutInfo->bailOutFunc);
    bailOutInstr->SetSrc1(implicitCallFlags);
    bailOutInstr->SetSrc2(noImplicitCall);
    bailOutTarget->InsertBefore(bailOutInstr);

    loop->endDisableImplicitCall = endDisableImplicitCall;
    return endDisableImplicitCall;
}